

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writeBinary(QPDFWriter *this,unsigned_long_long val,uint bytes)

{
  void *pvVar1;
  logic_error *this_00;
  size_t in_RCX;
  uchar data [8];
  
  if (bytes < 9) {
    pvVar1 = (void *)(ulong)bytes;
    while (pvVar1 != (void *)0x0) {
      pvVar1 = (void *)((long)pvVar1 - 1);
      in_RCX = (ulong)pvVar1 & 0xffffffff;
      data[in_RCX] = (uchar)val;
      val = val >> 8;
    }
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)data,(void *)(ulong)bytes,in_RCX);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"QPDFWriter::writeBinary called with too many bytes");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFWriter::writeBinary(unsigned long long val, unsigned int bytes)
{
    if (bytes > sizeof(unsigned long long)) {
        throw std::logic_error("QPDFWriter::writeBinary called with too many bytes");
    }
    unsigned char data[sizeof(unsigned long long)];
    for (unsigned int i = 0; i < bytes; ++i) {
        data[bytes - i - 1] = static_cast<unsigned char>(val & 0xff);
        val >>= 8;
    }
    m->pipeline->write(data, bytes);
}